

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTsim.c
# Opt level: O0

int Aig_TsiStateLookup(Aig_Tsi_t *p,uint *pState,int nWords)

{
  int iVar1;
  uint *puStack_30;
  int Hash;
  uint *pEntry;
  int nWords_local;
  uint *pState_local;
  Aig_Tsi_t *p_local;
  
  iVar1 = Aig_TsiStateHash(pState,nWords,p->nBins);
  puStack_30 = p->pBins[iVar1];
  while( true ) {
    if (puStack_30 == (uint *)0x0) {
      return 0;
    }
    iVar1 = memcmp(puStack_30,pState,(long)nWords << 2);
    if (iVar1 == 0) break;
    puStack_30 = Aig_TsiNext(puStack_30,nWords);
  }
  return 1;
}

Assistant:

int Aig_TsiStateLookup( Aig_Tsi_t * p, unsigned * pState, int nWords )
{
    unsigned * pEntry;
    int Hash;
    Hash = Aig_TsiStateHash( pState, nWords, p->nBins );
    for ( pEntry = p->pBins[Hash]; pEntry; pEntry = Aig_TsiNext(pEntry, nWords) )
        if ( !memcmp( pEntry, pState, sizeof(unsigned) * nWords ) )
            return 1;
    return 0;
}